

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar93;
  float fVar94;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  int local_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  int local_3e10;
  undefined8 *local_3e00;
  uint *local_3df8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3a40;
  float fStack_3a3c;
  float fStack_3a38;
  float fStack_3a34;
  float fStack_3a30;
  float fStack_3a2c;
  float fStack_3a28;
  float fStack_3a24;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3340;
  float fStack_333c;
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  float fStack_3324;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float fStack_3304;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  float fStack_22e8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint local_e80;
  uint uStack_e7c;
  uint uStack_e78;
  uint uStack_e74;
  uint uStack_e70;
  uint uStack_e6c;
  uint uStack_e68;
  uint uStack_e64;
  uint local_dc0;
  uint uStack_dbc;
  uint uStack_db8;
  uint uStack_db4;
  uint uStack_db0;
  uint uStack_dac;
  uint uStack_da8;
  uint uStack_da4;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  
  local_3e00 = in_RDX;
  local_3df8 = in_RSI;
  if (in_R8D == 8) {
    local_3e10 = 0;
    auVar15 = *in_RDI;
    auVar5 = *in_RDI;
    auVar4 = *in_RDI;
    auVar14 = *in_RDI;
    for (; local_3e10 < in_ECX; local_3e10 = local_3e10 + 1) {
      uVar1 = *local_3df8;
      auVar17 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar1),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar1),0x30);
      auVar18 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x30);
      uStack_3cb0 = auVar18._0_8_;
      uStack_3ca8 = auVar18._8_8_;
      auVar92._16_8_ = uStack_3cb0;
      auVar92._0_16_ = auVar17;
      auVar92._24_8_ = uStack_3ca8;
      auVar91._16_8_ = uStack_3cb0;
      auVar91._0_16_ = auVar17;
      auVar91._24_8_ = uStack_3ca8;
      auVar90._16_8_ = uStack_3cb0;
      auVar90._0_16_ = auVar17;
      auVar90._24_8_ = uStack_3ca8;
      auVar9._16_8_ = uStack_3cb0;
      auVar9._0_16_ = auVar17;
      auVar9._24_8_ = uStack_3ca8;
      auVar17 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0),0x30);
      uStack_39d0 = auVar18._0_8_;
      uStack_39c8 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x30);
      uStack_3990 = auVar19._0_8_;
      uStack_3988 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x40490fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x40490fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x40490fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x40490fdb),0x30);
      uStack_3950 = auVar20._0_8_;
      uStack_3948 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
      uStack_3910 = auVar21._0_8_;
      uStack_3908 = auVar21._8_8_;
      auVar8._16_8_ = uStack_39d0;
      auVar8._0_16_ = auVar17;
      auVar8._24_8_ = uStack_39c8;
      auVar8 = vcmpps_avx(auVar9,auVar8,4);
      auVar2._16_8_ = uStack_39d0;
      auVar2._0_16_ = auVar17;
      auVar2._24_8_ = uStack_39c8;
      auVar9 = vcmpps_avx(auVar14,auVar2,4);
      auVar8 = vandps_avx(auVar8,auVar9);
      auVar12._16_8_ = uStack_3990;
      auVar12._0_16_ = auVar18;
      auVar12._24_8_ = uStack_3988;
      auVar2 = vandps_avx(auVar12,auVar90);
      auVar7._16_8_ = uStack_3990;
      auVar7._0_16_ = auVar18;
      auVar7._24_8_ = uStack_3988;
      auVar3 = vandps_avx(auVar7,auVar4);
      auVar11._16_8_ = uStack_39d0;
      auVar11._0_16_ = auVar17;
      auVar11._24_8_ = uStack_39c8;
      auVar10 = vcmpps_avx(auVar91,auVar11,1);
      auVar11 = vcmpps_avx(auVar5,auVar11,1);
      auVar6._16_8_ = uStack_3990;
      auVar6._0_16_ = auVar18;
      auVar6._24_8_ = uStack_3988;
      auVar11 = vandps_avx(auVar11,auVar6);
      auVar57._16_8_ = uStack_3950;
      auVar57._0_16_ = auVar19;
      auVar57._24_8_ = uStack_3948;
      auVar11 = vorps_avx(auVar11,auVar57);
      auVar11 = vandps_avx(auVar10,auVar11);
      auVar16 = vdivps_avx(auVar15,auVar92);
      auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x30);
      uStack_1b10 = auVar21._0_8_;
      uStack_1b08 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      uStack_1ad0 = auVar22._0_8_;
      uStack_1ac8 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbf800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbf800000),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x30);
      uStack_1a90 = auVar23._0_8_;
      uStack_1a88 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3fc90fdb),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3fc90fdb),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x30);
      uStack_1a50 = auVar24._0_8_;
      uStack_1a48 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3f800000),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3f800000),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbeaaaa53),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbeaaaa53),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbeaaaa53),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbeaaaa53),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3e4cb974),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3e4cb974),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3e4cb974),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3e4cb974),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbe117200),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbe117200),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbe117200),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbe117200),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3dd9ed24),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3dd9ed24),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3dd9ed24),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3dd9ed24),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbd99b01e),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbd99b01e),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbd99b01e),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbd99b01e),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3d2edd4e),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3d2edd4e),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3d2edd4e),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3d2edd4e),0x30);
      auVar38 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbc83a25c),0x20);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbc83a25c),0x30);
      auVar39 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbc83a25c),0x20);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbc83a25c),0x30);
      auVar40 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3b3ac537),0x20);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3b3ac537),0x30);
      auVar41 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3b3ac537),0x20);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3b3ac537),0x30);
      auVar74._16_8_ = uStack_1b10;
      auVar74._0_16_ = auVar18;
      auVar74._24_8_ = uStack_1b08;
      auVar10 = vandps_avx(auVar74,auVar16);
      auVar77._16_8_ = uStack_1b10;
      auVar77._0_16_ = auVar18;
      auVar77._24_8_ = uStack_1b08;
      auVar12 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar6 = vandnps_avx(auVar77,auVar16);
      auVar71._16_8_ = uStack_1ad0;
      auVar71._0_16_ = auVar21;
      auVar71._24_8_ = uStack_1ac8;
      auVar13 = vcmpps_avx(auVar71,auVar6,1);
      auVar73._16_8_ = uStack_1a90;
      auVar73._0_16_ = auVar22;
      auVar73._24_8_ = uStack_1a88;
      auVar16 = vandps_avx(auVar13,auVar73);
      auVar7 = vandnps_avx(auVar13,auVar6);
      auVar7 = vorps_avx(auVar16,auVar7);
      auVar16 = vandps_avx(auVar13,auVar6);
      auVar76._16_8_ = uStack_1ad0;
      auVar76._0_16_ = auVar21;
      auVar76._24_8_ = uStack_1ac8;
      auVar6 = vandnps_avx(auVar13,auVar76);
      auVar16 = vorps_avx(auVar16,auVar6);
      auVar16 = vdivps_avx(auVar7,auVar16);
      local_1740 = auVar16._0_4_;
      fStack_173c = auVar16._4_4_;
      fStack_1738 = auVar16._8_4_;
      fStack_1734 = auVar16._12_4_;
      fStack_1730 = auVar16._16_4_;
      fStack_172c = auVar16._20_4_;
      fStack_1728 = auVar16._24_4_;
      fStack_1724 = auVar16._28_4_;
      fVar93 = local_1740 * local_1740;
      fVar97 = fStack_173c * fStack_173c;
      fVar99 = fStack_1738 * fStack_1738;
      fVar101 = fStack_1734 * fStack_1734;
      fVar103 = fStack_1730 * fStack_1730;
      fVar105 = fStack_172c * fStack_172c;
      fVar107 = fStack_1728 * fStack_1728;
      fVar94 = fVar93 * fVar93;
      fVar98 = fVar97 * fVar97;
      fVar100 = fVar99 * fVar99;
      fVar102 = fVar101 * fVar101;
      fVar104 = fVar103 * fVar103;
      fVar106 = fVar105 * fVar105;
      fVar108 = fVar107 * fVar107;
      local_1220 = auVar38._0_4_;
      fStack_121c = auVar38._4_4_;
      fStack_1218 = auVar38._8_4_;
      fStack_1214 = auVar38._12_4_;
      fStack_1210 = auVar39._0_4_;
      fStack_120c = auVar39._4_4_;
      fStack_1208 = auVar39._8_4_;
      local_1260 = auVar34._0_4_;
      fStack_125c = auVar34._4_4_;
      fStack_1258 = auVar34._8_4_;
      fStack_1254 = auVar34._12_4_;
      fStack_1250 = auVar35._0_4_;
      fStack_124c = auVar35._4_4_;
      fStack_1248 = auVar35._8_4_;
      local_1300 = auVar30._0_4_;
      fStack_12fc = auVar30._4_4_;
      fStack_12f8 = auVar30._8_4_;
      fStack_12f4 = auVar30._12_4_;
      fStack_12f0 = auVar31._0_4_;
      fStack_12ec = auVar31._4_4_;
      fStack_12e8 = auVar31._8_4_;
      local_13a0 = auVar26._0_4_;
      fStack_139c = auVar26._4_4_;
      fStack_1398 = auVar26._8_4_;
      fStack_1394 = auVar26._12_4_;
      fStack_1390 = auVar27._0_4_;
      fStack_138c = auVar27._4_4_;
      fStack_1388 = auVar27._8_4_;
      local_1400 = auVar40._0_4_;
      fStack_13fc = auVar40._4_4_;
      fStack_13f8 = auVar40._8_4_;
      fStack_13f4 = auVar40._12_4_;
      fStack_13f0 = auVar41._0_4_;
      fStack_13ec = auVar41._4_4_;
      fStack_13e8 = auVar41._8_4_;
      local_1440 = auVar36._0_4_;
      fStack_143c = auVar36._4_4_;
      fStack_1438 = auVar36._8_4_;
      fStack_1434 = auVar36._12_4_;
      fStack_1430 = auVar37._0_4_;
      fStack_142c = auVar37._4_4_;
      fStack_1428 = auVar37._8_4_;
      local_14e0 = auVar32._0_4_;
      fStack_14dc = auVar32._4_4_;
      fStack_14d8 = auVar32._8_4_;
      fStack_14d4 = auVar32._12_4_;
      fStack_14d0 = auVar33._0_4_;
      fStack_14cc = auVar33._4_4_;
      fStack_14c8 = auVar33._8_4_;
      local_1580 = auVar28._0_4_;
      fStack_157c = auVar28._4_4_;
      fStack_1578 = auVar28._8_4_;
      fStack_1574 = auVar28._12_4_;
      fStack_1570 = auVar29._0_4_;
      fStack_156c = auVar29._4_4_;
      fStack_1568 = auVar29._8_4_;
      local_1620 = auVar24._0_4_;
      fStack_161c = auVar24._4_4_;
      fStack_1618 = auVar24._8_4_;
      fStack_1614 = auVar24._12_4_;
      fStack_1610 = auVar25._0_4_;
      fStack_160c = auVar25._4_4_;
      fStack_1608 = auVar25._8_4_;
      auVar72._16_8_ = uStack_1a50;
      auVar72._0_16_ = auVar23;
      auVar72._24_8_ = uStack_1a48;
      auVar16 = vandps_avx(auVar13,auVar72);
      local_1ba0 = auVar16._0_4_;
      fStack_1b9c = auVar16._4_4_;
      fStack_1b98 = auVar16._8_4_;
      fStack_1b94 = auVar16._12_4_;
      fStack_1b90 = auVar16._16_4_;
      fStack_1b8c = auVar16._20_4_;
      fStack_1b88 = auVar16._24_4_;
      fStack_1b84 = auVar16._28_4_;
      auVar75._4_4_ =
           (fVar97 * (fVar98 * (fVar98 * (fVar98 * fStack_121c + fStack_125c) + fStack_12fc) +
                     fStack_139c) +
           fVar98 * (fVar98 * (fVar98 * (fVar98 * fStack_13fc + fStack_143c) + fStack_14dc) +
                    fStack_157c) + fStack_161c) * fStack_173c + fStack_1b9c;
      auVar75._0_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * local_1220 + local_1260) + local_1300) +
                     local_13a0) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * local_1400 + local_1440) + local_14e0) +
                    local_1580) + local_1620) * local_1740 + local_1ba0;
      auVar75._8_4_ =
           (fVar99 * (fVar100 * (fVar100 * (fVar100 * fStack_1218 + fStack_1258) + fStack_12f8) +
                     fStack_1398) +
           fVar100 * (fVar100 * (fVar100 * (fVar100 * fStack_13f8 + fStack_1438) + fStack_14d8) +
                     fStack_1578) + fStack_1618) * fStack_1738 + fStack_1b98;
      auVar75._12_4_ =
           (fVar101 * (fVar102 * (fVar102 * (fVar102 * fStack_1214 + fStack_1254) + fStack_12f4) +
                      fStack_1394) +
           fVar102 * (fVar102 * (fVar102 * (fVar102 * fStack_13f4 + fStack_1434) + fStack_14d4) +
                     fStack_1574) + fStack_1614) * fStack_1734 + fStack_1b94;
      auVar75._16_4_ =
           (fVar103 * (fVar104 * (fVar104 * (fVar104 * fStack_1210 + fStack_1250) + fStack_12f0) +
                      fStack_1390) +
           fVar104 * (fVar104 * (fVar104 * (fVar104 * fStack_13f0 + fStack_1430) + fStack_14d0) +
                     fStack_1570) + fStack_1610) * fStack_1730 + fStack_1b90;
      auVar75._20_4_ =
           (fVar105 * (fVar106 * (fVar106 * (fVar106 * fStack_120c + fStack_124c) + fStack_12ec) +
                      fStack_138c) +
           fVar106 * (fVar106 * (fVar106 * (fVar106 * fStack_13ec + fStack_142c) + fStack_14cc) +
                     fStack_156c) + fStack_160c) * fStack_172c + fStack_1b8c;
      auVar75._24_4_ =
           (fVar107 * (fVar108 * (fVar108 * (fVar108 * fStack_1208 + fStack_1248) + fStack_12e8) +
                      fStack_1388) +
           fVar108 * (fVar108 * (fVar108 * (fVar108 * fStack_13e8 + fStack_1428) + fStack_14c8) +
                     fStack_1568) + fStack_1608) * fStack_1728 + fStack_1b88;
      auVar75._28_4_ = fStack_1724 + fStack_1b84;
      auVar10 = vorps_avx(auVar75,auVar10);
      local_3a20 = auVar10._0_4_;
      fStack_3a1c = auVar10._4_4_;
      fStack_3a18 = auVar10._8_4_;
      fStack_3a14 = auVar10._12_4_;
      fStack_3a10 = auVar10._16_4_;
      fStack_3a0c = auVar10._20_4_;
      fStack_3a08 = auVar10._24_4_;
      fStack_3a04 = auVar10._28_4_;
      local_3a40 = auVar11._0_4_;
      fStack_3a3c = auVar11._4_4_;
      fStack_3a38 = auVar11._8_4_;
      fStack_3a34 = auVar11._12_4_;
      fStack_3a30 = auVar11._16_4_;
      fStack_3a2c = auVar11._20_4_;
      fStack_3a28 = auVar11._24_4_;
      fStack_3a24 = auVar11._28_4_;
      auVar56._16_8_ = uStack_3950;
      auVar56._0_16_ = auVar19;
      auVar56._24_8_ = uStack_3948;
      auVar2 = vorps_avx(auVar2,auVar56);
      auVar10._16_8_ = uStack_39d0;
      auVar10._0_16_ = auVar17;
      auVar10._24_8_ = uStack_39c8;
      auVar11 = vcmpps_avx(auVar2,auVar10,1);
      auVar13._16_8_ = uStack_3910;
      auVar13._0_16_ = auVar20;
      auVar13._24_8_ = uStack_3908;
      auVar2 = vorps_avx(auVar3,auVar13);
      auVar2 = vandps_avx(auVar9,auVar2);
      auVar3._16_8_ = uStack_3950;
      auVar3._0_16_ = auVar19;
      auVar3._24_8_ = uStack_3948;
      auVar3 = vandps_avx(auVar11,auVar3);
      auVar81._16_8_ = uStack_39d0;
      auVar81._0_16_ = auVar17;
      auVar81._24_8_ = uStack_39c8;
      auVar11 = vandnps_avx(auVar11,auVar81);
      auVar3 = vorps_avx(auVar3,auVar11);
      auVar3 = vandnps_avx(auVar9,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar16._4_4_ = fStack_3a1c + fStack_3a3c;
      auVar16._0_4_ = local_3a20 + local_3a40;
      auVar16._12_4_ = fStack_3a14 + fStack_3a34;
      auVar16._8_4_ = fStack_3a18 + fStack_3a38;
      auVar16._20_4_ = fStack_3a0c + fStack_3a2c;
      auVar16._16_4_ = fStack_3a10 + fStack_3a30;
      auVar16._28_4_ = fStack_3a04 + fStack_3a24;
      auVar16._24_4_ = fStack_3a08 + fStack_3a28;
      auVar2 = vandps_avx(auVar8,auVar16);
      local_dc0 = auVar8._0_4_;
      uStack_dbc = auVar8._4_4_;
      uStack_db8 = auVar8._8_4_;
      uStack_db4 = auVar8._12_4_;
      uStack_db0 = auVar8._16_4_;
      uStack_dac = auVar8._20_4_;
      uStack_da8 = auVar8._24_4_;
      uStack_da4 = auVar8._28_4_;
      auVar95._0_4_ = local_dc0 ^ auVar12._0_4_;
      auVar95._4_4_ = uStack_dbc ^ auVar12._4_4_;
      auVar95._8_4_ = uStack_db8 ^ auVar12._8_4_;
      auVar95._12_4_ = uStack_db4 ^ auVar12._12_4_;
      auVar95._16_4_ = uStack_db0 ^ auVar12._16_4_;
      auVar95._20_4_ = uStack_dac ^ auVar12._20_4_;
      auVar95._24_4_ = uStack_da8 ^ auVar12._24_4_;
      auVar95._28_4_ = uStack_da4 ^ auVar12._28_4_;
      auVar8 = vandps_avx(auVar95,auVar3);
      auVar8 = vorps_avx(auVar2,auVar8);
      local_3e80 = auVar8._0_8_;
      uStack_3e78 = auVar8._8_8_;
      uStack_3e70 = auVar8._16_8_;
      uStack_3e68 = auVar8._24_8_;
      *local_3e00 = local_3e80;
      local_3e00[1] = uStack_3e78;
      local_3e00[2] = uStack_3e70;
      local_3e00[3] = uStack_3e68;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 4;
    }
  }
  if (in_R8D == 4) {
    local_3e84 = 0;
    uVar50 = *(undefined8 *)*in_RDI;
    uVar51 = *(undefined8 *)(*in_RDI + 8);
    auVar24 = *(undefined1 (*) [16])*in_RDI;
    auVar23 = *(undefined1 (*) [16])*in_RDI;
    auVar22 = *(undefined1 (*) [16])*in_RDI;
    auVar21 = *(undefined1 (*) [16])*in_RDI;
    auVar20 = *(undefined1 (*) [16])*in_RDI;
    auVar19 = *(undefined1 (*) [16])*in_RDI;
    auVar18 = *(undefined1 (*) [16])*in_RDI;
    auVar17 = *(undefined1 (*) [16])*in_RDI;
    for (; local_3e84 + 1 < in_ECX; local_3e84 = local_3e84 + 2) {
      uVar1 = *local_3df8;
      uVar54 = CONCAT44(uVar1,uVar1);
      uVar55 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3df8[1];
      uVar52 = CONCAT44(uVar1,uVar1);
      uVar53 = CONCAT44(uVar1,uVar1);
      auVar89._16_8_ = uVar50;
      auVar89._0_16_ = auVar20;
      auVar89._24_8_ = uVar51;
      auVar88._16_8_ = uVar50;
      auVar88._0_16_ = auVar19;
      auVar88._24_8_ = uVar51;
      auVar87._16_8_ = uVar50;
      auVar87._0_16_ = auVar18;
      auVar87._24_8_ = uVar51;
      auVar86._16_8_ = uVar50;
      auVar86._0_16_ = auVar17;
      auVar86._24_8_ = uVar51;
      auVar85._8_8_ = uVar55;
      auVar85._0_8_ = uVar54;
      auVar85._16_8_ = uVar52;
      auVar85._24_8_ = uVar53;
      auVar84._8_8_ = uVar55;
      auVar84._0_8_ = uVar54;
      auVar84._16_8_ = uVar52;
      auVar84._24_8_ = uVar53;
      auVar83._8_8_ = uVar55;
      auVar83._0_8_ = uVar54;
      auVar83._16_8_ = uVar52;
      auVar83._24_8_ = uVar53;
      auVar82._8_8_ = uVar55;
      auVar82._0_8_ = uVar54;
      auVar82._16_8_ = uVar52;
      auVar82._24_8_ = uVar53;
      auVar25 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0),0x30);
      uStack_32d0 = auVar26._0_8_;
      uStack_32c8 = auVar26._8_8_;
      auVar26 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x80000000),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x80000000),0x30);
      uStack_3290 = auVar27._0_8_;
      uStack_3288 = auVar27._8_8_;
      auVar27 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x40490fdb),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x40490fdb),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x40490fdb),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x40490fdb),0x30);
      uStack_3250 = auVar28._0_8_;
      uStack_3248 = auVar28._8_8_;
      auVar28 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3fc90fdb),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3fc90fdb),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3fc90fdb),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3fc90fdb),0x30);
      uStack_3210 = auVar29._0_8_;
      uStack_3208 = auVar29._8_8_;
      auVar14._16_8_ = uStack_32d0;
      auVar14._0_16_ = auVar25;
      auVar14._24_8_ = uStack_32c8;
      auVar14 = vcmpps_avx(auVar82,auVar14,4);
      auVar4._16_8_ = uStack_32d0;
      auVar4._0_16_ = auVar25;
      auVar4._24_8_ = uStack_32c8;
      auVar10 = vcmpps_avx(auVar86,auVar4,4);
      auVar14 = vandps_avx(auVar14,auVar10);
      auVar62._16_8_ = uStack_3290;
      auVar62._0_16_ = auVar26;
      auVar62._24_8_ = uStack_3288;
      auVar4 = vandps_avx(auVar62,auVar83);
      auVar61._16_8_ = uStack_3290;
      auVar61._0_16_ = auVar26;
      auVar61._24_8_ = uStack_3288;
      auVar5 = vandps_avx(auVar61,auVar87);
      auVar15._16_8_ = uStack_32d0;
      auVar15._0_16_ = auVar25;
      auVar15._24_8_ = uStack_32c8;
      auVar8 = vcmpps_avx(auVar84,auVar15,1);
      auVar15 = vcmpps_avx(auVar88,auVar15,1);
      auVar60._16_8_ = uStack_3290;
      auVar60._0_16_ = auVar26;
      auVar60._24_8_ = uStack_3288;
      auVar15 = vandps_avx(auVar15,auVar60);
      auVar65._16_8_ = uStack_3250;
      auVar65._0_16_ = auVar27;
      auVar65._24_8_ = uStack_3248;
      auVar15 = vorps_avx(auVar15,auVar65);
      auVar15 = vandps_avx(auVar8,auVar15);
      auVar2 = vdivps_avx(auVar89,auVar85);
      auVar26 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x80000000),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x80000000),0x30);
      uStack_2a10 = auVar29._0_8_;
      uStack_2a08 = auVar29._8_8_;
      auVar29 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3f800000),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3f800000),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3f800000),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3f800000),0x30);
      uStack_29d0 = auVar30._0_8_;
      uStack_29c8 = auVar30._8_8_;
      auVar30 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbf800000),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbf800000),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbf800000),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbf800000),0x30);
      uStack_2990 = auVar31._0_8_;
      uStack_2988 = auVar31._8_8_;
      auVar31 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3fc90fdb),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3fc90fdb),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3fc90fdb),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3fc90fdb),0x30);
      uStack_2950 = auVar32._0_8_;
      uStack_2948 = auVar32._8_8_;
      auVar32 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3f800000),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3f800000),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3f800000),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3f800000),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbeaaaa53),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbeaaaa53),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbeaaaa53),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbeaaaa53),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3e4cb974),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3e4cb974),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3e4cb974),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3e4cb974),0x30);
      auVar38 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbe117200),0x20);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbe117200),0x30);
      auVar39 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbe117200),0x20);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbe117200),0x30);
      auVar40 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3dd9ed24),0x20);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3dd9ed24),0x30);
      auVar41 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3dd9ed24),0x20);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3dd9ed24),0x30);
      auVar42 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar42 = vinsertps_avx(auVar42,ZEXT416(0xbd99b01e),0x20);
      auVar42 = vinsertps_avx(auVar42,ZEXT416(0xbd99b01e),0x30);
      auVar43 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar43 = vinsertps_avx(auVar43,ZEXT416(0xbd99b01e),0x20);
      auVar43 = vinsertps_avx(auVar43,ZEXT416(0xbd99b01e),0x30);
      auVar44 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar44 = vinsertps_avx(auVar44,ZEXT416(0x3d2edd4e),0x20);
      auVar44 = vinsertps_avx(auVar44,ZEXT416(0x3d2edd4e),0x30);
      auVar45 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(0x3d2edd4e),0x20);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(0x3d2edd4e),0x30);
      auVar46 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar46 = vinsertps_avx(auVar46,ZEXT416(0xbc83a25c),0x20);
      auVar46 = vinsertps_avx(auVar46,ZEXT416(0xbc83a25c),0x30);
      auVar47 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar47 = vinsertps_avx(auVar47,ZEXT416(0xbc83a25c),0x20);
      auVar47 = vinsertps_avx(auVar47,ZEXT416(0xbc83a25c),0x30);
      auVar48 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar48 = vinsertps_avx(auVar48,ZEXT416(0x3b3ac537),0x20);
      auVar48 = vinsertps_avx(auVar48,ZEXT416(0x3b3ac537),0x30);
      auVar49 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar49 = vinsertps_avx(auVar49,ZEXT416(0x3b3ac537),0x20);
      auVar49 = vinsertps_avx(auVar49,ZEXT416(0x3b3ac537),0x30);
      auVar69._16_8_ = uStack_2a10;
      auVar69._0_16_ = auVar26;
      auVar69._24_8_ = uStack_2a08;
      auVar8 = vandps_avx(auVar69,auVar2);
      auVar79._16_8_ = uStack_2a10;
      auVar79._0_16_ = auVar26;
      auVar79._24_8_ = uStack_2a08;
      auVar16 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar3 = vandnps_avx(auVar79,auVar2);
      auVar66._16_8_ = uStack_29d0;
      auVar66._0_16_ = auVar29;
      auVar66._24_8_ = uStack_29c8;
      auVar6 = vcmpps_avx(auVar66,auVar3,1);
      auVar68._16_8_ = uStack_2990;
      auVar68._0_16_ = auVar30;
      auVar68._24_8_ = uStack_2988;
      auVar2 = vandps_avx(auVar6,auVar68);
      auVar11 = vandnps_avx(auVar6,auVar3);
      auVar11 = vorps_avx(auVar2,auVar11);
      auVar2 = vandps_avx(auVar6,auVar3);
      auVar78._16_8_ = uStack_29d0;
      auVar78._0_16_ = auVar29;
      auVar78._24_8_ = uStack_29c8;
      auVar3 = vandnps_avx(auVar6,auVar78);
      auVar2 = vorps_avx(auVar2,auVar3);
      auVar2 = vdivps_avx(auVar11,auVar2);
      local_2640 = auVar2._0_4_;
      fStack_263c = auVar2._4_4_;
      fStack_2638 = auVar2._8_4_;
      fStack_2634 = auVar2._12_4_;
      fStack_2630 = auVar2._16_4_;
      fStack_262c = auVar2._20_4_;
      fStack_2628 = auVar2._24_4_;
      fStack_2624 = auVar2._28_4_;
      fVar93 = local_2640 * local_2640;
      fVar97 = fStack_263c * fStack_263c;
      fVar99 = fStack_2638 * fStack_2638;
      fVar101 = fStack_2634 * fStack_2634;
      fVar103 = fStack_2630 * fStack_2630;
      fVar105 = fStack_262c * fStack_262c;
      fVar107 = fStack_2628 * fStack_2628;
      fVar94 = fVar93 * fVar93;
      fVar98 = fVar97 * fVar97;
      fVar100 = fVar99 * fVar99;
      fVar102 = fVar101 * fVar101;
      fVar104 = fVar103 * fVar103;
      fVar106 = fVar105 * fVar105;
      fVar108 = fVar107 * fVar107;
      local_2120 = auVar46._0_4_;
      fStack_211c = auVar46._4_4_;
      fStack_2118 = auVar46._8_4_;
      fStack_2114 = auVar46._12_4_;
      fStack_2110 = auVar47._0_4_;
      fStack_210c = auVar47._4_4_;
      fStack_2108 = auVar47._8_4_;
      local_2160 = auVar42._0_4_;
      fStack_215c = auVar42._4_4_;
      fStack_2158 = auVar42._8_4_;
      fStack_2154 = auVar42._12_4_;
      fStack_2150 = auVar43._0_4_;
      fStack_214c = auVar43._4_4_;
      fStack_2148 = auVar43._8_4_;
      local_2200 = auVar38._0_4_;
      fStack_21fc = auVar38._4_4_;
      fStack_21f8 = auVar38._8_4_;
      fStack_21f4 = auVar38._12_4_;
      fStack_21f0 = auVar39._0_4_;
      fStack_21ec = auVar39._4_4_;
      fStack_21e8 = auVar39._8_4_;
      local_22a0 = auVar34._0_4_;
      fStack_229c = auVar34._4_4_;
      fStack_2298 = auVar34._8_4_;
      fStack_2294 = auVar34._12_4_;
      fStack_2290 = auVar35._0_4_;
      fStack_228c = auVar35._4_4_;
      fStack_2288 = auVar35._8_4_;
      local_2300 = auVar48._0_4_;
      fStack_22fc = auVar48._4_4_;
      fStack_22f8 = auVar48._8_4_;
      fStack_22f4 = auVar48._12_4_;
      fStack_22f0 = auVar49._0_4_;
      fStack_22ec = auVar49._4_4_;
      fStack_22e8 = auVar49._8_4_;
      local_2340 = auVar44._0_4_;
      fStack_233c = auVar44._4_4_;
      fStack_2338 = auVar44._8_4_;
      fStack_2334 = auVar44._12_4_;
      fStack_2330 = auVar45._0_4_;
      fStack_232c = auVar45._4_4_;
      fStack_2328 = auVar45._8_4_;
      local_23e0 = auVar40._0_4_;
      fStack_23dc = auVar40._4_4_;
      fStack_23d8 = auVar40._8_4_;
      fStack_23d4 = auVar40._12_4_;
      fStack_23d0 = auVar41._0_4_;
      fStack_23cc = auVar41._4_4_;
      fStack_23c8 = auVar41._8_4_;
      local_2480 = auVar36._0_4_;
      fStack_247c = auVar36._4_4_;
      fStack_2478 = auVar36._8_4_;
      fStack_2474 = auVar36._12_4_;
      fStack_2470 = auVar37._0_4_;
      fStack_246c = auVar37._4_4_;
      fStack_2468 = auVar37._8_4_;
      local_2520 = auVar32._0_4_;
      fStack_251c = auVar32._4_4_;
      fStack_2518 = auVar32._8_4_;
      fStack_2514 = auVar32._12_4_;
      fStack_2510 = auVar33._0_4_;
      fStack_250c = auVar33._4_4_;
      fStack_2508 = auVar33._8_4_;
      auVar67._16_8_ = uStack_2950;
      auVar67._0_16_ = auVar31;
      auVar67._24_8_ = uStack_2948;
      auVar2 = vandps_avx(auVar6,auVar67);
      local_2aa0 = auVar2._0_4_;
      fStack_2a9c = auVar2._4_4_;
      fStack_2a98 = auVar2._8_4_;
      fStack_2a94 = auVar2._12_4_;
      fStack_2a90 = auVar2._16_4_;
      fStack_2a8c = auVar2._20_4_;
      fStack_2a88 = auVar2._24_4_;
      fStack_2a84 = auVar2._28_4_;
      auVar70._4_4_ =
           (fVar97 * (fVar98 * (fVar98 * (fVar98 * fStack_211c + fStack_215c) + fStack_21fc) +
                     fStack_229c) +
           fVar98 * (fVar98 * (fVar98 * (fVar98 * fStack_22fc + fStack_233c) + fStack_23dc) +
                    fStack_247c) + fStack_251c) * fStack_263c + fStack_2a9c;
      auVar70._0_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * local_2120 + local_2160) + local_2200) +
                     local_22a0) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * local_2300 + local_2340) + local_23e0) +
                    local_2480) + local_2520) * local_2640 + local_2aa0;
      auVar70._8_4_ =
           (fVar99 * (fVar100 * (fVar100 * (fVar100 * fStack_2118 + fStack_2158) + fStack_21f8) +
                     fStack_2298) +
           fVar100 * (fVar100 * (fVar100 * (fVar100 * fStack_22f8 + fStack_2338) + fStack_23d8) +
                     fStack_2478) + fStack_2518) * fStack_2638 + fStack_2a98;
      auVar70._12_4_ =
           (fVar101 * (fVar102 * (fVar102 * (fVar102 * fStack_2114 + fStack_2154) + fStack_21f4) +
                      fStack_2294) +
           fVar102 * (fVar102 * (fVar102 * (fVar102 * fStack_22f4 + fStack_2334) + fStack_23d4) +
                     fStack_2474) + fStack_2514) * fStack_2634 + fStack_2a94;
      auVar70._16_4_ =
           (fVar103 * (fVar104 * (fVar104 * (fVar104 * fStack_2110 + fStack_2150) + fStack_21f0) +
                      fStack_2290) +
           fVar104 * (fVar104 * (fVar104 * (fVar104 * fStack_22f0 + fStack_2330) + fStack_23d0) +
                     fStack_2470) + fStack_2510) * fStack_2630 + fStack_2a90;
      auVar70._20_4_ =
           (fVar105 * (fVar106 * (fVar106 * (fVar106 * fStack_210c + fStack_214c) + fStack_21ec) +
                      fStack_228c) +
           fVar106 * (fVar106 * (fVar106 * (fVar106 * fStack_22ec + fStack_232c) + fStack_23cc) +
                     fStack_246c) + fStack_250c) * fStack_262c + fStack_2a8c;
      auVar70._24_4_ =
           (fVar107 * (fVar108 * (fVar108 * (fVar108 * fStack_2108 + fStack_2148) + fStack_21e8) +
                      fStack_2288) +
           fVar108 * (fVar108 * (fVar108 * (fVar108 * fStack_22e8 + fStack_2328) + fStack_23c8) +
                     fStack_2468) + fStack_2508) * fStack_2628 + fStack_2a88;
      auVar70._28_4_ = fStack_2624 + fStack_2a84;
      auVar8 = vorps_avx(auVar70,auVar8);
      local_3320 = auVar8._0_4_;
      fStack_331c = auVar8._4_4_;
      fStack_3318 = auVar8._8_4_;
      fStack_3314 = auVar8._12_4_;
      fStack_3310 = auVar8._16_4_;
      fStack_330c = auVar8._20_4_;
      fStack_3308 = auVar8._24_4_;
      fStack_3304 = auVar8._28_4_;
      local_3340 = auVar15._0_4_;
      fStack_333c = auVar15._4_4_;
      fStack_3338 = auVar15._8_4_;
      fStack_3334 = auVar15._12_4_;
      fStack_3330 = auVar15._16_4_;
      fStack_332c = auVar15._20_4_;
      fStack_3328 = auVar15._24_4_;
      fStack_3324 = auVar15._28_4_;
      auVar64._16_8_ = uStack_3250;
      auVar64._0_16_ = auVar27;
      auVar64._24_8_ = uStack_3248;
      auVar4 = vorps_avx(auVar4,auVar64);
      auVar58._16_8_ = uStack_32d0;
      auVar58._0_16_ = auVar25;
      auVar58._24_8_ = uStack_32c8;
      auVar15 = vcmpps_avx(auVar4,auVar58,1);
      auVar63._16_8_ = uStack_3210;
      auVar63._0_16_ = auVar28;
      auVar63._24_8_ = uStack_3208;
      auVar4 = vorps_avx(auVar5,auVar63);
      auVar4 = vandps_avx(auVar10,auVar4);
      auVar5._16_8_ = uStack_3250;
      auVar5._0_16_ = auVar27;
      auVar5._24_8_ = uStack_3248;
      auVar5 = vandps_avx(auVar15,auVar5);
      auVar80._16_8_ = uStack_32d0;
      auVar80._0_16_ = auVar25;
      auVar80._24_8_ = uStack_32c8;
      auVar15 = vandnps_avx(auVar15,auVar80);
      auVar5 = vorps_avx(auVar5,auVar15);
      auVar5 = vandnps_avx(auVar10,auVar5);
      auVar5 = vorps_avx(auVar4,auVar5);
      auVar59._4_4_ = fStack_331c + fStack_333c;
      auVar59._0_4_ = local_3320 + local_3340;
      auVar59._12_4_ = fStack_3314 + fStack_3334;
      auVar59._8_4_ = fStack_3318 + fStack_3338;
      auVar59._20_4_ = fStack_330c + fStack_332c;
      auVar59._16_4_ = fStack_3310 + fStack_3330;
      auVar59._28_4_ = fStack_3304 + fStack_3324;
      auVar59._24_4_ = fStack_3308 + fStack_3328;
      auVar4 = vandps_avx(auVar14,auVar59);
      local_e80 = auVar14._0_4_;
      uStack_e7c = auVar14._4_4_;
      uStack_e78 = auVar14._8_4_;
      uStack_e74 = auVar14._12_4_;
      uStack_e70 = auVar14._16_4_;
      uStack_e6c = auVar14._20_4_;
      uStack_e68 = auVar14._24_4_;
      uStack_e64 = auVar14._28_4_;
      auVar96._0_4_ = local_e80 ^ auVar16._0_4_;
      auVar96._4_4_ = uStack_e7c ^ auVar16._4_4_;
      auVar96._8_4_ = uStack_e78 ^ auVar16._8_4_;
      auVar96._12_4_ = uStack_e74 ^ auVar16._12_4_;
      auVar96._16_4_ = uStack_e70 ^ auVar16._16_4_;
      auVar96._20_4_ = uStack_e6c ^ auVar16._20_4_;
      auVar96._24_4_ = uStack_e68 ^ auVar16._24_4_;
      auVar96._28_4_ = uStack_e64 ^ auVar16._28_4_;
      auVar14 = vandps_avx(auVar96,auVar5);
      auVar14 = vorps_avx(auVar4,auVar14);
      local_3f20 = auVar14._0_8_;
      uStack_3f18 = auVar14._8_8_;
      uStack_3f10 = auVar14._16_8_;
      uStack_3f08 = auVar14._24_8_;
      *local_3e00 = local_3f20;
      local_3e00[1] = uStack_3f18;
      local_3e00[2] = uStack_3f10;
      local_3e00[3] = uStack_3f08;
      local_3df8 = local_3df8 + 2;
      local_3e00 = local_3e00 + 4;
    }
    for (; local_3e84 < in_ECX; local_3e84 = local_3e84 + 1) {
      uVar1 = *local_3df8;
      uVar50 = CONCAT44(uVar1,uVar1);
      uVar51 = CONCAT44(uVar1,uVar1);
      auVar40._8_8_ = uVar51;
      auVar40._0_8_ = uVar50;
      auVar39._8_8_ = uVar51;
      auVar39._0_8_ = uVar50;
      auVar38._8_8_ = uVar51;
      auVar38._0_8_ = uVar50;
      auVar18._8_8_ = uVar51;
      auVar18._0_8_ = uVar50;
      auVar17 = vcmpps_avx(auVar18,ZEXT816(0),4);
      auVar18 = vcmpps_avx(auVar21,ZEXT816(0),4);
      auVar20 = vpand_avx(auVar17,auVar18);
      auVar26._8_8_ = 0x8000000080000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar25 = vpand_avx(auVar26,auVar38);
      auVar19._8_8_ = 0x8000000080000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar26 = vpand_avx(auVar19,auVar22);
      auVar17 = vcmpps_avx(auVar39,ZEXT816(0),1);
      auVar19 = vcmpps_avx(auVar23,ZEXT816(0),1);
      auVar27._8_8_ = 0x8000000080000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar19 = vpand_avx(auVar19,auVar27);
      auVar30._8_8_ = 0x40490fdb40490fdb;
      auVar30._0_8_ = 0x40490fdb40490fdb;
      auVar19 = vpor_avx(auVar19,auVar30);
      auVar27 = vpand_avx(auVar17,auVar19);
      auVar17 = vdivps_avx(auVar24,auVar40);
      auVar31._8_8_ = 0x8000000080000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar28 = vpand_avx(auVar31,auVar17);
      auVar37._8_8_ = 0x8000000080000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar31 = vpcmpeqd_avx(auVar30,auVar30);
      auVar29 = vpandn_avx(auVar37,auVar17);
      auVar35._8_8_ = 0x3f8000003f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar17 = vcmpps_avx(auVar35,auVar29,1);
      auVar33._8_8_ = 0xbf800000bf800000;
      auVar33._0_8_ = 0xbf800000bf800000;
      auVar19 = vpand_avx(auVar17,auVar33);
      auVar30 = vpandn_avx(auVar17,auVar29);
      auVar30 = vpor_avx(auVar19,auVar30);
      auVar19 = vpand_avx(auVar17,auVar29);
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar29 = vpandn_avx(auVar17,auVar36);
      auVar19 = vpor_avx(auVar19,auVar29);
      auVar19 = vdivps_avx(auVar30,auVar19);
      local_6d0 = auVar19._0_4_;
      fStack_6cc = auVar19._4_4_;
      fStack_6c8 = auVar19._8_4_;
      fStack_6c4 = auVar19._12_4_;
      fVar93 = local_6d0 * local_6d0;
      fVar97 = fStack_6cc * fStack_6cc;
      fVar99 = fStack_6c8 * fStack_6c8;
      fVar101 = fStack_6c4 * fStack_6c4;
      fVar94 = fVar93 * fVar93;
      fVar98 = fVar97 * fVar97;
      fVar100 = fVar99 * fVar99;
      fVar102 = fVar101 * fVar101;
      auVar32._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar32._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar17 = vpand_avx(auVar17,auVar32);
      local_740 = auVar17._0_4_;
      fStack_73c = auVar17._4_4_;
      fStack_738 = auVar17._8_4_;
      fStack_734 = auVar17._12_4_;
      auVar34._4_4_ =
           (fVar97 * (fVar98 * (fVar98 * (fVar98 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar98 * (fVar98 * (fVar98 * (fVar98 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6cc + fStack_73c;
      auVar34._0_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * local_6d0 + local_740;
      auVar34._8_4_ =
           (fVar99 * (fVar100 * (fVar100 * (fVar100 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar100 * (fVar100 * (fVar100 * (fVar100 * 0.0028498897 + 0.04269152) + 0.10640934) +
                     0.1999262) + 1.0) * fStack_6c8 + fStack_738;
      auVar34._12_4_ =
           (fVar101 * (fVar102 * (fVar102 * (fVar102 * -0.01606863 + -0.07504295) + -0.14203644) +
                      -0.33333072) +
           fVar102 * (fVar102 * (fVar102 * (fVar102 * 0.0028498897 + 0.04269152) + 0.10640934) +
                     0.1999262) + 1.0) * fStack_6c4 + fStack_734;
      auVar17 = vpor_avx(auVar34,auVar28);
      local_c20 = auVar17._0_4_;
      fStack_c1c = auVar17._4_4_;
      fStack_c18 = auVar17._8_4_;
      fStack_c14 = auVar17._12_4_;
      local_c30 = auVar27._0_4_;
      fStack_c2c = auVar27._4_4_;
      fStack_c28 = auVar27._8_4_;
      fStack_c24 = auVar27._12_4_;
      auVar29._8_8_ = 0x40490fdb40490fdb;
      auVar29._0_8_ = 0x40490fdb40490fdb;
      auVar17 = vpor_avx(auVar25,auVar29);
      auVar17 = vcmpps_avx(auVar17,ZEXT816(0),1);
      auVar28._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar28._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar19 = vpor_avx(auVar26,auVar28);
      auVar19 = vpand_avx(auVar18,auVar19);
      auVar25._8_8_ = 0x40490fdb40490fdb;
      auVar25._0_8_ = 0x40490fdb40490fdb;
      auVar25 = vpand_avx(auVar17,auVar25);
      auVar17 = vpandn_avx(auVar17,ZEXT816(0));
      auVar17 = vpor_avx(auVar25,auVar17);
      auVar17 = vpandn_avx(auVar18,auVar17);
      auVar18 = vpor_avx(auVar19,auVar17);
      auVar17._4_4_ = fStack_c1c + fStack_c2c;
      auVar17._0_4_ = local_c20 + local_c30;
      auVar17._12_4_ = fStack_c14 + fStack_c24;
      auVar17._8_4_ = fStack_c18 + fStack_c28;
      auVar17 = vpand_avx(auVar20,auVar17);
      auVar18 = vpand_avx(auVar20 ^ auVar31,auVar18);
      auVar17 = vpor_avx(auVar17,auVar18);
      local_3f40 = auVar17._0_8_;
      uStack_3f38 = auVar17._8_8_;
      *local_3e00 = local_3f40;
      local_3e00[1] = uStack_3f38;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}